

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O2

void __thiscall Security::InsertNOPs(Security *this)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  int iVar2;
  Instr *instr;
  Instr *this_00;
  
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,InsertNOPsPhase,sourceContextId,functionId);
  if (!bVar1) {
    bVar1 = Js::ConfigFlagsTable::IsEnabled
                      ((ConfigFlagsTable *)&Js::Configuration::Global,DebugFlag);
    if (!bVar1) {
      this_00 = (Instr *)&Js::Configuration::Global;
      bVar1 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,BenchmarkFlag);
      if (!bVar1) {
        instr = this->func->m_headInstr;
        while( true ) {
          iVar2 = GetNextNOPInsertPoint((Security *)this_00);
          while( true ) {
            bVar1 = iVar2 == 0;
            iVar2 = iVar2 + -1;
            if ((instr == (Instr *)0x0) || (bVar1)) break;
            this_00 = instr;
            instr = IR::Instr::GetNextRealInstr(instr);
          }
          if (instr == (Instr *)0x0) break;
          InsertNOPBefore((Security *)this_00,instr);
        }
      }
    }
  }
  return;
}

Assistant:

void
Security::InsertNOPs()
{
    if (PHASE_OFF(Js::InsertNOPsPhase, this->func) || CONFIG_ISENABLED(Js::DebugFlag) || CONFIG_ISENABLED(Js::BenchmarkFlag))
    {
        return;
    }

    int count = 0;
    IR::Instr *instr = this->func->m_headInstr;

    while (true)
    {
        count = this->GetNextNOPInsertPoint();
        while (instr && count--)
        {
            instr = instr->GetNextRealInstr();
        }
        if (instr == nullptr)
        {
            break;
        }
        this->InsertNOPBefore(instr);
    };
}